

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

ssize_t __thiscall
QTextStreamPrivate::write(QTextStreamPrivate *this,int __fd,void *__buf,size_t __n)

{
  QString *pQVar1;
  QString *extraout_RAX;
  undefined4 in_register_00000034;
  QTextStreamPrivate *this_00;
  
  this_00 = (QTextStreamPrivate *)CONCAT44(in_register_00000034,__fd);
  if (this->string == (QString *)0x0) {
    QString::append((QString *)this_00,(QChar *)__buf,(qsizetype)this);
    pQVar1 = (QString *)QString::size(&this->writeBuffer);
    if (0x4000 < (long)pQVar1) {
      flushWriteBuffer(this_00);
      pQVar1 = extraout_RAX;
    }
  }
  else {
    pQVar1 = QString::append((QString *)this_00,(QChar *)__buf,(qsizetype)this);
  }
  return (ssize_t)pQVar1;
}

Assistant:

void QTextStreamPrivate::write(const QChar *data, qsizetype len)
{
    if (string) {
        // ### What about seek()??
        string->append(data, len);
    } else {
        writeBuffer.append(data, len);
        if (writeBuffer.size() > QTEXTSTREAM_BUFFERSIZE)
            flushWriteBuffer();
    }
}